

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QRectF * __thiscall
QGraphicsItemPrivate::effectiveBoundingRect(QGraphicsItemPrivate *this,QRectF *rect)

{
  bool bVar1;
  QGraphicsView **ppQVar2;
  qreal *in_RDX;
  QGraphicsItemPrivate *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *view;
  QList<QGraphicsView_*> *__range2;
  QGraphicsEffect *effect;
  QGraphicsItem *q;
  QRect deviceEffectRect;
  QRectF deviceRect;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QGraphicsView_*> views;
  QRectF sceneEffectRect;
  QRectF sceneRect;
  QRectF *this_00;
  QRectF *in_stack_fffffffffffffee8;
  QGraphicsViewPrivate *this_01;
  QGraphicsItem *in_stack_fffffffffffffef0;
  QRectF *rect_00;
  QGraphicsItem *this_02;
  undefined1 local_c8 [32];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  QGraphicsView **local_78;
  const_iterator local_70;
  const_iterator local_68;
  undefined1 local_60 [32];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  q_func(in_RSI);
  this_02 = (QGraphicsItem *)in_RSI->graphicsEffect;
  if (((in_RSI->scene == (QGraphicsScene *)0x0) || (this_02 == (QGraphicsItem *)0x0)) ||
     (bVar1 = QGraphicsEffect::isEnabled((QGraphicsEffect *)in_RDI), !bVar1)) {
    in_RDI->xp = *in_RDX;
    in_RDI->yp = in_RDX[1];
    in_RDI->w = in_RDX[2];
    in_RDI->h = in_RDX[3];
  }
  else {
    QGraphicsScene::d_func((QGraphicsScene *)0x97c4c6);
    bVar1 = QList<QGraphicsView_*>::isEmpty((QList<QGraphicsView_*> *)0x97c4d5);
    if (bVar1) {
      (**(code **)(*(long *)&this_02->_vptr_QGraphicsItem + 0x60))(in_RDI,this_02,in_RDX);
    }
    else {
      local_28 = 0xffffffffffffffff;
      local_20 = 0xffffffffffffffff;
      local_18 = 0xffffffffffffffff;
      local_10 = 0xffffffffffffffff;
      QGraphicsItem::mapRectToScene(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      local_60._24_8_ = -NAN;
      local_40 = 0xffffffffffffffff;
      local_38 = 0xffffffffffffffff;
      local_30 = 0xffffffffffffffff;
      QRectF::QRectF((QRectF *)(local_60 + 0x18));
      local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_60._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsScene::views((QGraphicsScene *)this_00);
      rect_00 = (QRectF *)local_60;
      local_68.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = QList<QGraphicsView_*>::begin((QList<QGraphicsView_*> *)in_RDI);
      local_70.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      local_70 = QList<QGraphicsView_*>::end((QList<QGraphicsView_*> *)in_RDI);
      while( true ) {
        local_78 = local_70.i;
        bVar1 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_68,local_70);
        if (!bVar1) break;
        ppQVar2 = QList<QGraphicsView_*>::const_iterator::operator*(&local_68);
        this_01 = (QGraphicsViewPrivate *)*ppQVar2;
        local_98 = 0xffffffffffffffff;
        local_90 = 0xffffffffffffffff;
        local_88 = 0xffffffffffffffff;
        local_80 = 0xffffffffffffffff;
        QGraphicsView::d_func((QGraphicsView *)0x97c6be);
        QGraphicsViewPrivate::mapRectFromScene(this_01,(QRectF *)in_RSI);
        local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        (**(code **)(*(long *)&this_02->_vptr_QGraphicsItem + 0x60))(local_c8,this_02,&local_98);
        local_a8 = QRectF::toAlignedRect();
        QGraphicsView::d_func((QGraphicsView *)0x97c730);
        QGraphicsViewPrivate::mapRectToScene(this_01,(QRect *)in_RSI);
        QRectF::operator|=(this_00,in_RDI);
        QList<QGraphicsView_*>::const_iterator::operator++(&local_68);
      }
      QGraphicsItem::mapRectFromScene(this_02,rect_00);
      QList<QGraphicsView_*>::~QList((QList<QGraphicsView_*> *)0x97c78d);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QRectF QGraphicsItemPrivate::effectiveBoundingRect(const QRectF &rect) const
{
#if QT_CONFIG(graphicseffect)
    Q_Q(const QGraphicsItem);
    QGraphicsEffect *effect = graphicsEffect;
    if (scene && effect && effect->isEnabled()) {
        if (scene->d_func()->views.isEmpty())
            return effect->boundingRectFor(rect);
        QRectF sceneRect = q->mapRectToScene(rect);
        QRectF sceneEffectRect;
        const auto views = scene->views();
        for (QGraphicsView *view : views) {
            QRectF deviceRect = view->d_func()->mapRectFromScene(sceneRect);
            QRect deviceEffectRect = effect->boundingRectFor(deviceRect).toAlignedRect();
            sceneEffectRect |= view->d_func()->mapRectToScene(deviceEffectRect);
        }
        return q->mapRectFromScene(sceneEffectRect);
    }
#endif // QT_CONFIG(graphicseffect)
    return rect;
}